

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O0

int oonf_main(int argc,char **argv,oonf_appdata *appdata)

{
  _Bool _Var1;
  int iVar2;
  __uid_t _Var3;
  cfg_db *db;
  int *piVar4;
  char *pcVar5;
  oonf_log_severity def_severity;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 uVar6;
  uint local_84;
  int result;
  int return_code;
  oonf_appdata *appdata_local;
  char **argv_local;
  int argc_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_84 = 1;
  _schema_name = (char *)0x0;
  _display_schema = false;
  _debug_early = false;
  _ignore_unknown = false;
  _end_oonf_signal = false;
  setup_signalhandler();
  parse_early_commandline(argc,argv);
  os_core_generic_syslog_init(appdata->app_name);
  def_severity = LOG_SEVERITY_WARN;
  if ((_debug_early & 1U) != 0) {
    def_severity = LOG_SEVERITY_DEBUG;
  }
  iVar2 = oonf_log_init(appdata,def_severity);
  if (iVar2 == 0) {
    oonf_subsystem_init();
    iVar2 = oonf_cfg_init(argc,argv,appdata->default_cfg_handler);
    if (iVar2 == 0) {
      oonf_logcfg_init();
      local_84 = parse_commandline(argc,argv,appdata,false);
      if (local_84 == 0xffffffff) {
        local_84 = 1;
        iVar2 = oonf_cfg_update_globalcfg(true);
        if (iVar2 == 0) {
          db = oonf_cfg_get_rawdb();
          iVar2 = oonf_logcfg_apply(db);
          if ((iVar2 == 0) && (iVar2 = oonf_cfg_load_subsystems(), iVar2 == 0)) {
            if ((_display_schema & 1U) == 0) {
              if (((appdata->need_root & 1U) == 0) || (_Var3 = geteuid(), _Var3 == 0)) {
                if (((appdata->need_lock & 1U) == 0) ||
                   ((((config_global.lockfile == (char *)0x0 || (*config_global.lockfile == '\0'))
                     || (iVar2 = strcmp(config_global.lockfile,"-"), iVar2 == 0)) ||
                    (iVar2 = os_core_linux_create_lockfile(config_global.lockfile), iVar2 == 0)))) {
                  oonf_cfg_initplugins();
                  iVar2 = oonf_cfg_apply();
                  if (iVar2 == 0) {
                    _Var1 = oonf_cfg_is_running();
                    if (_Var1) {
                      if (_handle_scheduling == (_func_int *)0x0) {
                        if ((log_global_mask[1] & 4) != 0) {
                          oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0x102,
                                   (void *)0x0,0,"No event scheduler present");
                        }
                        local_84 = 1;
                      }
                      else {
                        if (((config_global.fork & 1U) != 0) && ((_display_schema & 1U) == 0)) {
                          iVar2 = daemon(0,0);
                          if (iVar2 < 0) {
                            if ((log_global_mask[1] & 4) != 0) {
                              piVar4 = __errno_location();
                              pcVar5 = strerror(*piVar4);
                              piVar4 = __errno_location();
                              oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0x10a,
                                       (void *)0x0,0,"Could not fork into background: %s (%d)",
                                       pcVar5,*piVar4);
                            }
                            goto LAB_0017d1df;
                          }
                          if (((config_global.pidfile != (char *)0x0) &&
                              (*config_global.pidfile != '\0')) &&
                             (iVar2 = _write_pidfile(config_global.pidfile), iVar2 != 0))
                          goto LAB_0017d1df;
                        }
                        local_84 = mainloop(argc,argv,appdata);
                        oonf_subsystem_initiate_shutdown();
                        do {
                          iVar2 = (*_handle_scheduling)();
                        } while (iVar2 == 0);
                      }
                    }
                    else {
                      local_84 = (uint)((_end_oonf_signal & 1U) == 0);
                    }
                  }
                }
                else if ((log_global_mask[1] & 4) != 0) {
                  oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0xeb,(void *)0x0,0,
                           "Could not acquire application lock \'%s\'",config_global.lockfile);
                }
              }
              else if ((log_global_mask[1] & 4) != 0) {
                oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0xe2,(void *)0x0,0,
                         "You must be root(uid = 0) to run %s!\n",appdata->app_name);
              }
            }
            else {
              local_84 = display_schema();
            }
          }
        }
        else if ((log_global_mask[1] & 4) != 0) {
          oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0xcb,(void *)0x0,0,
                   "Cannot read global configuration section (%d)",CONCAT44(uVar6,iVar2));
        }
      }
    }
  }
LAB_0017d1df:
  oonf_cfg_unconfigure_subsystems();
  oonf_subsystem_cleanup();
  oonf_logcfg_cleanup();
  oonf_cfg_cleanup();
  oonf_log_cleanup();
  os_core_generic_syslog_cleanup();
  return local_84;
}

Assistant:

int
oonf_main(int argc, char **argv, const struct oonf_appdata *appdata) {
  int return_code;
  int result;

  /* early initialization */
  return_code = 1;

  _schema_name = NULL;
  _display_schema = false;
  _debug_early = false;
  _ignore_unknown = false;

  /* setup signal handler */
  _end_oonf_signal = false;
  setup_signalhandler();

  /* parse "early" command line arguments */
  parse_early_commandline(argc, argv);

  /* initialize core */
  os_core_init(appdata->app_name);

  /* initialize logger */
  if (oonf_log_init(appdata, _debug_early ? LOG_SEVERITY_DEBUG : LOG_SEVERITY_WARN)) {
    goto oonf_cleanup;
  }

  /* prepare plugin initialization */
  oonf_subsystem_init();

  /* initialize configuration system */
  if (oonf_cfg_init(argc, argv, appdata->default_cfg_handler)) {
    goto oonf_cleanup;
  }

  /* add custom configuration definitions */
  oonf_logcfg_init();

  /* parse command line and read configuration files */
  return_code = parse_commandline(argc, argv, appdata, false);
  if (return_code != -1) {
    /* end OONFd now */
    goto oonf_cleanup;
  }

  /* prepare for an error during initialization */
  return_code = 1;

  /* read global section early */
  if ((result = oonf_cfg_update_globalcfg(true))) {
    OONF_WARN(LOG_MAIN, "Cannot read global configuration section (%d)", result);
    goto oonf_cleanup;
  }

  /* configure logger */
  if (oonf_logcfg_apply(oonf_cfg_get_rawdb())) {
    goto oonf_cleanup;
  }

  /* load plugins */
  if (oonf_cfg_load_subsystems()) {
    goto oonf_cleanup;
  }

  /* show schema if necessary */
  if (_display_schema) {
    return_code = display_schema();
    goto oonf_cleanup;
  }

  /* check if we are root, otherwise stop */
  if (appdata->need_root) {
    if (geteuid() != 0) {
      OONF_WARN(LOG_MAIN, "You must be root(uid = 0) to run %s!\n", appdata->app_name);
      goto oonf_cleanup;
    }
  }

  if (appdata->need_lock && config_global.lockfile != NULL && *config_global.lockfile != 0 &&
      strcmp(config_global.lockfile, "-") != 0) {
    /* create application lock */
    if (os_core_create_lockfile(config_global.lockfile)) {
      OONF_WARN(LOG_MAIN, "Could not acquire application lock '%s'", config_global.lockfile);
      goto oonf_cleanup;
    }
  }

  /* call initialization callbacks of dynamic plugins */
  oonf_cfg_initplugins();

  /* apply configuration */
  if (oonf_cfg_apply()) {
    goto oonf_cleanup;
  }

  if (!oonf_cfg_is_running()) {
    /*
     * mayor error during late initialization
     * or maybe the user decided otherwise and pressed CTRL-C
     */
    return_code = _end_oonf_signal ? 0 : 1;
    goto oonf_cleanup;
  }

  if (!_handle_scheduling) {
    OONF_WARN(LOG_MAIN, "No event scheduler present");
    return_code = 1;
    goto oonf_cleanup;
  }
  /* see if we need to fork */
  if (config_global.fork && !_display_schema) {
    /* tell main process that we are finished with initialization */
    if (daemon(0, 0) < 0) {
      OONF_WARN(LOG_MAIN, "Could not fork into background: %s (%d)", strerror(errno), errno);
      goto oonf_cleanup;
    }

    if (config_global.pidfile && *config_global.pidfile != 0) {
      if (_write_pidfile(config_global.pidfile)) {
        goto oonf_cleanup;
      }
    }
  }

  /* activate mainloop */
  return_code = mainloop(argc, argv, appdata);

  /* tell plugins shutdown is in progress */
  oonf_subsystem_initiate_shutdown();

  /* wait for 500 ms and process socket events */
  while (!_handle_scheduling())
    ;

oonf_cleanup:
  /* free plugins */
  oonf_cfg_unconfigure_subsystems();
  oonf_subsystem_cleanup();

  /* free logging/config bridge resources */
  oonf_logcfg_cleanup();

  /* free configuration resources */
  oonf_cfg_cleanup();

  /* free logger resources */
  oonf_log_cleanup();

  /* free core resources */
  os_core_cleanup();

  return return_code;
}